

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_validate.cpp
# Opt level: O2

int __thiscall ktx::CommandValidate::main(CommandValidate *this,int argc,char **argv)

{
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"ktx validate",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "Validates the Khronos texture format version 2 (KTX2) file specified\n    as the input-file argument. It prints any found errors and warnings to stdout."
             ,&local_62);
  Command::parseCommandLine(&this->super_Command,&local_60,&local_40,argc,argv);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  executeValidate(this);
  return 0;
}

Assistant:

int CommandValidate::main(int argc, char* argv[]) {
    try {
        parseCommandLine("ktx validate",
                "Validates the Khronos texture format version 2 (KTX2) file specified\n"
                "    as the input-file argument. It prints any found errors and warnings to stdout.",
                argc, argv);
        executeValidate();
        return +rc::SUCCESS;
    } catch (const FatalError& error) {
        return +error.returnCode;
    } catch (const std::exception& e) {
        fmt::print(std::cerr, "{} fatal: {}\n", commandName, e.what());
        return +rc::RUNTIME_ERROR;
    }
}